

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O3

string * __thiscall
cmFileAPI::NoSupportedVersion_abi_cxx11_
          (string *__return_storage_ptr__,cmFileAPI *this,
          vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_> *versions)

{
  cmake *pcVar1;
  ostream *poVar2;
  RequestVersion *v;
  cmake *pcVar3;
  ostringstream msg;
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"no supported version specified",0x1e);
  if (this->CMakeInstance != (cmake *)(this->APIv1)._M_dataplus._M_p) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," among:",7);
    pcVar3 = this->CMakeInstance;
    pcVar1 = (cmake *)(this->APIv1)._M_dataplus._M_p;
    if (pcVar3 != pcVar1) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        pcVar3 = (cmake *)&(pcVar3->Generators).
                           super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
      } while (pcVar3 != pcVar1);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string cmFileAPI::NoSupportedVersion(
  std::vector<RequestVersion> const& versions)
{
  std::ostringstream msg;
  msg << "no supported version specified";
  if (!versions.empty()) {
    msg << " among:";
    for (RequestVersion const& v : versions) {
      msg << " " << v.Major << "." << v.Minor;
    }
  }
  return msg.str();
}